

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHasNsProp(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  xmlAttrPtr val_01;
  uint local_44;
  int n_nameSpace;
  xmlChar *nameSpace;
  int n_name;
  xmlChar *name;
  int n_node;
  xmlNode *node;
  xmlAttrPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 1; name._4_4_ = name._4_4_ + 1) {
    for (nameSpace._4_4_ = 0; (int)nameSpace._4_4_ < 5; nameSpace._4_4_ = nameSpace._4_4_ + 1) {
      for (local_44 = 0; (int)local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(nameSpace._4_4_,1);
        val_00 = gen_const_xmlChar_ptr(local_44,2);
        val_01 = (xmlAttrPtr)xmlHasNsProp(0,val,val_00);
        desret_xmlAttrPtr(val_01);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(nameSpace._4_4_,val,1);
        des_const_xmlChar_ptr(local_44,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)nameSpace._4_4_);
          printf(" %d",(ulong)local_44);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlHasNsProp(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttrPtr ret_val;
    const xmlNode * node; /* the node */
    int n_node;
    const xmlChar * name; /* the attribute name */
    int n_name;
    const xmlChar * nameSpace; /* the URI of the namespace */
    int n_nameSpace;

    for (n_node = 0;n_node < gen_nb_const_xmlNode_ptr;n_node++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_nameSpace = 0;n_nameSpace < gen_nb_const_xmlChar_ptr;n_nameSpace++) {
        mem_base = xmlMemBlocks();
        node = gen_const_xmlNode_ptr(n_node, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        nameSpace = gen_const_xmlChar_ptr(n_nameSpace, 2);

        ret_val = xmlHasNsProp(node, name, nameSpace);
        desret_xmlAttrPtr(ret_val);
        call_tests++;
        des_const_xmlNode_ptr(n_node, node, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_nameSpace, nameSpace, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHasNsProp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_name);
            printf(" %d", n_nameSpace);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}